

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

void __thiscall RegexTree::RegexTree(RegexTree *this,char *str)

{
  tree_node *ptVar1;
  tree_node *ptVar2;
  size_t sVar3;
  
  ptVar1 = (tree_node *)operator_new(0x18);
  ptVar1->left = (tree_node *)0x0;
  ptVar1->right = (tree_node *)0x0;
  this->root = ptVar1;
  ptVar1->c = '\b';
  ptVar2 = (tree_node *)operator_new(0x18);
  ptVar2->left = (tree_node *)0x0;
  ptVar2->right = (tree_node *)0x0;
  ptVar1->right = ptVar2;
  ptVar2->c = '\x0f';
  sVar3 = strlen(str);
  ptVar1 = build_block(this,str,(int)sVar3);
  this->root->left = ptVar1;
  ptVar1 = clean_block(this,ptVar1);
  this->root->left = ptVar1;
  return;
}

Assistant:

RegexTree::RegexTree(const char *str) {
    root = new tree_node;
    root->c = CAT;
    root->right = new tree_node;
    root->right->c = ACCEPT;

    int len = static_cast<int>(strlen(str));
    root->left = build_block(str, len);
    root->left = clean_block(root->left);
}